

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::Deserialize(Deserializer *deserializer,ScalarFunction *param_2)

{
  pointer pCVar1;
  ClientContext *context;
  SequenceCatalogEntry *args;
  undefined1 local_30 [8];
  long *local_28;
  _Map_pointer local_20;
  
  local_28 = (long *)0x0;
  Deserializer::
  ReadPropertyWithExplicitDefault<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((Deserializer *)local_30,(field_id_t)param_2,(char *)0x64,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             "sequence_create_info");
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  local_28 = (long *)0x0;
  if ((_Head_base<0UL,_duckdb::CreateInfo_*,_false>)local_30 ==
      (_Head_base<0UL,_duckdb::CreateInfo_*,_false>)0x0) {
    deserializer->_vptr_Deserializer = (_func_int **)0x0;
  }
  else {
    pCVar1 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                         *)local_30);
    context = SerializationData::Get<duckdb::ClientContext&>
                        ((SerializationData *)
                         &(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                          name._M_string_length);
    args = BindSequenceFromContext(context,&pCVar1->catalog,&pCVar1->schema,(string *)(pCVar1 + 1));
    make_uniq<duckdb::NextvalBindData,duckdb::SequenceCatalogEntry&>((duckdb *)&local_20,args);
    deserializer->_vptr_Deserializer = (_func_int **)local_20;
    if (local_30 != (undefined1  [8])0x0) {
      (*((ParseInfo *)local_30)->_vptr_ParseInfo[1])();
    }
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, ScalarFunction &) {
	auto create_info = deserializer.ReadPropertyWithExplicitDefault<unique_ptr<CreateInfo>>(100, "sequence_create_info",
	                                                                                        unique_ptr<CreateInfo>());
	if (!create_info) {
		return nullptr;
	}
	auto &seq_info = create_info->Cast<CreateSequenceInfo>();
	auto &context = deserializer.Get<ClientContext &>();
	auto &sequence = BindSequenceFromContext(context, seq_info.catalog, seq_info.schema, seq_info.name);
	return make_uniq<NextvalBindData>(sequence);
}